

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void * fio_message_metadata(fio_msg_s *msg,intptr_t type_id)

{
  undefined8 *puVar1;
  long *plVar2;
  size_t sVar3;
  long lVar4;
  undefined8 *puVar5;
  
  sVar3 = msg[1].channel.capa;
  lVar4 = sVar3 + 1;
  puVar5 = (undefined8 *)(msg[1].channel.len + sVar3 * 0x18 + 0x10);
  do {
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      return (void *)0x0;
    }
    puVar1 = puVar5 + -3;
    plVar2 = puVar5 + -5;
    puVar5 = puVar1;
  } while (*plVar2 != type_id);
  return (void *)*puVar1;
}

Assistant:

void *fio_message_metadata(fio_msg_s *msg, intptr_t type_id) {
  fio_msg_metadata_s *meta = ((fio_msg_client_s *)msg)->meta;
  size_t len = ((fio_msg_client_s *)msg)->meta_len;
  while (len) {
    --len;
    if (meta[len].type_id == type_id)
      return meta[len].metadata;
  }
  return NULL;
}